

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_port_resp(Curl_easy *data,int ftpcode)

{
  undefined1 *puVar1;
  int iVar2;
  connectdata *pcVar3;
  CURLcode CVar4;
  ftpport fcmd;
  
  if (ftpcode - 200U < 100) {
    Curl_infof(data,"Connect data stream actively");
    (data->conn->proto).ftpc.state = FTP_STOP;
    CVar4 = ftp_dophase_done(data,false);
    return CVar4;
  }
  pcVar3 = data->conn;
  iVar2 = (pcVar3->proto).ftpc.count1;
  if (iVar2 == 0) {
    Curl_infof(data,"disabling EPRT usage");
    puVar1 = &(pcVar3->bits).field_0x6;
    *puVar1 = *puVar1 & 0xef;
  }
  fcmd = iVar2 + PORT;
  if (fcmd == DONE) {
    Curl_failf(data,"Failed to do PORT");
    return CURLE_FTP_PORT_FAILED;
  }
  CVar4 = ftp_state_use_port(data,fcmd);
  return CVar4;
}

Assistant:

static CURLcode ftp_state_port_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  ftpport fcmd = (ftpport)ftpc->count1;
  CURLcode result = CURLE_OK;

  /* The FTP spec tells a positive response should have code 200.
     Be more permissive here to tolerate deviant servers. */
  if(ftpcode / 100 != 2) {
    /* the command failed */

    if(EPRT == fcmd) {
      infof(data, "disabling EPRT usage");
      conn->bits.ftp_use_eprt = FALSE;
    }
    fcmd++;

    if(fcmd == DONE) {
      failf(data, "Failed to do PORT");
      result = CURLE_FTP_PORT_FAILED;
    }
    else
      /* try next */
      result = ftp_state_use_port(data, fcmd);
  }
  else {
    infof(data, "Connect data stream actively");
    state(data, FTP_STOP); /* end of DO phase */
    result = ftp_dophase_done(data, FALSE);
  }

  return result;
}